

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

cbtHullTriangle * __thiscall HullLibrary::extrudable(HullLibrary *this,cbtScalar epsilon)

{
  cbtHullTriangle *pcVar1;
  ulong uVar2;
  cbtHullTriangle *pcVar3;
  
  uVar2 = 0;
  pcVar3 = (cbtHullTriangle *)0x0;
  do {
    pcVar1 = *(cbtHullTriangle **)(*(long *)(this + 0x10) + uVar2 * 8);
    if ((pcVar3 == (cbtHullTriangle *)0x0) ||
       ((pcVar1 != (cbtHullTriangle *)0x0 && (pcVar3->rise < pcVar1->rise)))) {
      pcVar3 = pcVar1;
    }
    uVar2 = uVar2 + 1;
  } while (*(uint *)(this + 4) != uVar2);
  pcVar1 = (cbtHullTriangle *)0x0;
  if (epsilon < pcVar3->rise) {
    pcVar1 = pcVar3;
  }
  return pcVar1;
}

Assistant:

cbtHullTriangle *HullLibrary::extrudable(cbtScalar epsilon)
{
	int i;
	cbtHullTriangle *t = NULL;
	for (i = 0; i < m_tris.size(); i++)
	{
		if (!t || (m_tris[i] && t->rise < m_tris[i]->rise))
		{
			t = m_tris[i];
		}
	}
	return (t->rise > epsilon) ? t : NULL;
}